

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

TValue * index2addr(lua_State *L,int idx)

{
  ushort uVar1;
  CallInfo *pCVar2;
  lua_CFunction p_Var3;
  uint __line;
  TValue *pTVar4;
  char *__assertion;
  
  pCVar2 = L->ci;
  if (idx < 1) {
    if (idx < -0xf4627) {
      if (idx == -0xf4628) {
        return &L->l_G->l_registry;
      }
      if ((uint)idx < 0xfff0b95a) {
        __assertion = "(idx <= 125 + 1) && \"upvalue index too large\"";
        __line = 0x51;
      }
      else {
        uVar1 = pCVar2->func->tt_;
        if ((uVar1 & 0x7f) == 0x46 || uVar1 == 0x16) {
LAB_0010ae46:
          return &luaO_nilobject_;
        }
        if (uVar1 == 0x8026) {
          p_Var3 = (pCVar2->func->value_).f;
          if (p_Var3[8] == (_func_int_lua_State_ptr)0x26) {
            if (-idx - 0xf4628U <= (uint)(byte)p_Var3[10]) {
              return (TValue *)(p_Var3 + (ulong)(-idx - 0xf4629) * 0x10 + 0x20);
            }
            goto LAB_0010ae46;
          }
          __assertion = "(((ci->func)->value_).gc)->tt == ((6) | ((2) << 4))";
        }
        else {
          __assertion = "((((ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))";
        }
        __line = 0x55;
      }
    }
    else {
      if ((idx != 0) &&
         ((long)(ulong)(uint)-idx <= (long)L->top + (-0x10 - (long)pCVar2->func) >> 4)) {
        return L->top + idx;
      }
      __assertion = "(idx != 0 && -idx <= L->top - (ci->func + 1)) && \"invalid index\"";
      __line = 0x4a;
    }
  }
  else {
    if ((long)(ulong)(uint)idx <= (long)pCVar2->top + (-0x10 - (long)pCVar2->func) >> 4) {
      pTVar4 = pCVar2->func + (uint)idx;
      if (pTVar4 < L->top) {
        return pTVar4;
      }
      goto LAB_0010ae46;
    }
    __assertion = "(idx <= ci->top - (ci->func + 1)) && \"unacceptable index\"";
    __line = 0x45;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,__line,"TValue *index2addr(lua_State *, int)");
}

Assistant:

static TValue *index2addr (lua_State *L, int idx) {
  CallInfo *ci = L->ci;
  if (idx > 0) {
    TValue *o = ci->func + idx;
    api_check(L, idx <= ci->top - (ci->func + 1), "unacceptable index");
    if (o >= L->top) return NONVALIDVALUE;
    else return o;
  }
  else if (!ispseudo(idx)) {  /* negative index */
    api_check(L, idx != 0 && -idx <= L->top - (ci->func + 1), "invalid index");
    return L->top + idx;
  }
  else if (idx == LUA_REGISTRYINDEX)
    return &G(L)->l_registry;
  else {  /* upvalues */
    idx = LUA_REGISTRYINDEX - idx;
    api_check(L, idx <= MAXUPVAL + 1, "upvalue index too large");
    if (ttislcf(ci->func) || ttisfcf(ci->func))  /* light C function? */
      return NONVALIDVALUE;  /* it has no upvalues */
    else {
      CClosure *func = clCvalue(ci->func);
      return (idx <= func->nupvalues) ? &func->upvalue[idx-1] : NONVALIDVALUE;
    }
  }
}